

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_serial.cpp
# Opt level: O0

int SerialDataInOutputQueue(int port)

{
  int local_14;
  int fd;
  int bytes;
  int port_local;
  
  local_14 = 0;
  fd = port;
  bytes = FindFD(port);
  if (-1 < bytes) {
    ioctl(bytes,0x5411,&local_14);
    bytes = local_14;
  }
  return bytes;
}

Assistant:

int SerialDataInOutputQueue(int port) {
    int bytes = 0;
    int fd = FindFD(port);

    if (fd < 0)            ///< error
        return fd;

    ioctl(fd, TIOCOUTQ, &bytes);
    return bytes;
}